

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O1

void InitNet(void)

{
  size_t sVar1;
  float fVar2;
  longlong lVar3;
  real *prVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  longlong lVar8;
  
  posix_memalign(&syn0,0x80,vocab_size * layer1_size * 4);
  if (syn0 != (real *)0x0) {
    if (hs != 0) {
      posix_memalign(&syn1,0x80,vocab_size * layer1_size * 4);
      lVar3 = layer1_size;
      if (syn1 == (real *)0x0) goto LAB_0010344a;
      if (0 < vocab_size) {
        sVar1 = layer1_size * 4;
        prVar4 = syn1;
        lVar8 = vocab_size;
        do {
          if (0 < lVar3) {
            memset(prVar4,0,sVar1);
          }
          prVar4 = prVar4 + lVar3;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
    }
    if (0 < negative) {
      posix_memalign(&syn1neg,0x80,vocab_size * layer1_size * 4);
      lVar3 = layer1_size;
      if (syn1neg == (real *)0x0) goto LAB_0010344a;
      if (0 < vocab_size) {
        sVar1 = layer1_size * 4;
        prVar4 = syn1neg;
        lVar8 = vocab_size;
        do {
          if (0 < lVar3) {
            memset(prVar4,0,sVar1);
          }
          prVar4 = prVar4 + lVar3;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
    }
    lVar8 = vocab_size;
    lVar3 = layer1_size;
    if (0 < vocab_size) {
      fVar2 = (float)layer1_size;
      uVar5 = 1;
      lVar6 = 0;
      prVar4 = syn0;
      do {
        if (0 < lVar3) {
          lVar7 = 0;
          do {
            uVar5 = uVar5 * -0x1993 + 0xb;
            prVar4[lVar7] = ((float)uVar5 * 1.5258789e-05 + -0.5) / fVar2;
            lVar7 = lVar7 + 1;
          } while (lVar3 != lVar7);
        }
        lVar6 = lVar6 + 1;
        prVar4 = prVar4 + lVar3;
      } while (lVar6 != lVar8);
    }
    CreateBinaryTree();
    return;
  }
LAB_0010344a:
  puts("Memory allocation failed");
  exit(1);
}

Assistant:

void InitNet() {
  long long a, b;
  unsigned long long next_random = 1;
  a = posix_memalign((void **)&syn0, 128, (long long)vocab_size * layer1_size * sizeof(real));
  if (syn0 == NULL) {printf("Memory allocation failed\n"); exit(1);}
  if (hs) {
    a = posix_memalign((void **)&syn1, 128, (long long)vocab_size * layer1_size * sizeof(real));
    if (syn1 == NULL) {printf("Memory allocation failed\n"); exit(1);}
    for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++)
     syn1[a * layer1_size + b] = 0;
  }
  if (negative>0) {
    a = posix_memalign((void **)&syn1neg, 128, (long long)vocab_size * layer1_size * sizeof(real));
    if (syn1neg == NULL) {printf("Memory allocation failed\n"); exit(1);}
    for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++)
     syn1neg[a * layer1_size + b] = 0;
  }
  for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++) {
    next_random = next_random * (unsigned long long)25214903917 + 11;
    syn0[a * layer1_size + b] = (((next_random & 0xFFFF) / (real)65536) - 0.5) / layer1_size;
  }
  CreateBinaryTree();
}